

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

bill_x * onbill(obj *obj,monst *shkp,boolean silent)

{
  int local_34;
  bill_x *pbStack_30;
  int ct;
  bill_x *bp;
  boolean silent_local;
  monst *shkp_local;
  obj *obj_local;
  
  if (shkp != (monst *)0x0) {
    pbStack_30 = *(bill_x **)&shkp[0x1b].mnum;
    local_34 = (int)*(short *)((long)&shkp[0x1b].misc_worn_check + 2);
    while (local_34 = local_34 + -1, -1 < local_34) {
      if (pbStack_30->bo_id == obj->o_id) {
        if ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) {
          pline("onbill: paid obj on bill?");
        }
        return pbStack_30;
      }
      pbStack_30 = pbStack_30 + 1;
    }
  }
  if (((*(uint *)&obj->field_0x4a >> 2 & 1) != 0) && (silent == '\0')) {
    pline("onbill: unpaid obj not on bill?");
  }
  return (bill_x *)0x0;
}

Assistant:

static struct bill_x *onbill(const struct obj *obj, struct monst *shkp, boolean silent)
{
	if (shkp) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		while (--ct >= 0)
		    if (bp->bo_id == obj->o_id) {
			if (!obj->unpaid) pline("onbill: paid obj on bill?");
			return bp;
		    } else bp++;
	}
	if (obj->unpaid && !silent) pline("onbill: unpaid obj not on bill?");
	return NULL;
}